

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

int __thiscall soplex::SPxDantzigPR<double>::selectLeave(SPxDantzigPR<double> *this)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  if (pSVar2->sparsePricingLeave == true) {
    iVar4 = selectLeaveSparse(this);
    return iVar4;
  }
  uVar6 = (ulong)(pSVar2->thecovectors->set).thenum;
  if (0 < (long)uVar6) {
    dVar7 = -(this->super_SPxPricer<double>).thetolerance;
    uVar5 = 0xffffffff;
    dVar8 = dVar7;
    do {
      dVar1 = (pSVar2->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6 - 1];
      if (dVar1 < dVar7 && dVar1 < dVar8) {
        uVar5 = uVar6 - 1 & 0xffffffff;
        dVar8 = dVar1;
      }
      bVar3 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
    return (int)uVar5;
  }
  return -1;
}

Assistant:

int SPxDantzigPR<R>::selectLeave()
{
   assert(this->thesolver != nullptr);

   if(this->thesolver->sparsePricingLeave)
      return selectLeaveSparse();

   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   R best = -this->thetolerance;
   int  n    = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      R x = this->thesolver->fTest()[i];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = i;
            best = x;
         }
      }
   }

   return n;
}